

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int resolveSelectStep(Walker *pWalker,Select *p)

{
  byte *pbVar1;
  Parse *pParse;
  NameContext *pOuterNC;
  SrcList *pSVar2;
  Select *pSVar3;
  char *pcVar4;
  ExprList *pEVar5;
  Window *pWVar6;
  sqlite3 *psVar7;
  Expr *pEVar8;
  bool bVar9;
  byte bVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  Expr *p_00;
  Expr *pEVar14;
  ExprList_item *pEVar15;
  ulong uVar16;
  ulong uVar17;
  Expr *pE;
  Expr *pEVar18;
  ulong uVar19;
  long lVar20;
  char *pcVar21;
  long lVar22;
  Select *pSVar23;
  Window **ppWVar24;
  sqlite3 *psVar25;
  Select *pSVar26;
  bool bVar27;
  NameContext sNC;
  int local_94;
  int local_7c;
  Parse *local_78;
  sqlite3 *local_70;
  NameContext local_68;
  
  iVar12 = 1;
  if ((p->selFlags & 4) == 0) {
    pParse = pWalker->pParse;
    pOuterNC = (pWalker->u).pNC;
    if ((p->selFlags & 0x40) == 0) {
      sqlite3SelectPrep(pParse,p,pOuterNC);
      iVar12 = 2 - (uint)(pParse->nErr == 0);
    }
    else {
      local_70 = pParse->db;
      pSVar26 = p->pPrior;
      iVar12 = 0;
      pSVar23 = p;
      while( true ) {
        lVar22 = 0x45;
        if (pSVar23 == (Select *)0x0) break;
        *(byte *)&pSVar23->selFlags = (byte)pSVar23->selFlags | 4;
        local_68.pNext = (NameContext *)0x0;
        local_68.nRef = 0;
        local_68.nNcErr = 0;
        local_68.ncFlags = 0;
        local_68._44_4_ = 0;
        local_68.pSrcList = (SrcList *)0x0;
        local_68.uNC.pEList = (ExprList *)0x0;
        local_68.pParse = pParse;
        local_68.pWinSelect = pSVar23;
        iVar11 = sqlite3ResolveExprNames(&local_68,pSVar23->pLimit);
        if (iVar11 != 0) goto LAB_0019c87d;
        if ((pSVar23->selFlags & 0x10000) != 0) {
          (pSVar23->pSrc->a[0].pSelect)->pOrderBy = pSVar23->pOrderBy;
          pSVar23->pOrderBy = (ExprList *)0x0;
        }
        local_78 = (Parse *)CONCAT44(local_78._4_4_,iVar12);
        for (lVar20 = 0; pSVar2 = pSVar23->pSrc, lVar20 < pSVar2->nSrc; lVar20 = lVar20 + 1) {
          pSVar3 = *(Select **)((long)pSVar2->a + lVar22 + -0x1d);
          if ((pSVar3 != (Select *)0x0) && ((pSVar3->selFlags & 4) == 0)) {
            if (pOuterNC == (NameContext *)0x0) {
              local_94 = 0;
            }
            else {
              local_94 = pOuterNC->nRef;
            }
            pcVar21 = pParse->zAuthContext;
            pcVar4 = *(char **)((long)pSVar2->a + lVar22 + -0x35);
            if (pcVar4 != (char *)0x0) {
              pParse->zAuthContext = pcVar4;
            }
            sqlite3ResolveSelectNames(pParse,pSVar3,pOuterNC);
            pParse->zAuthContext = pcVar21;
            if (pParse->nErr != 0) goto LAB_0019c87d;
            if (pOuterNC != (NameContext *)0x0) {
              *(ushort *)((long)pSVar2->a + lVar22 + -8) =
                   (*(ushort *)((long)pSVar2->a + lVar22 + -8) & 0xfff7) +
                   (ushort)(local_94 < pOuterNC->nRef) * 8;
            }
          }
          lVar22 = lVar22 + 0x68;
        }
        local_68.ncFlags = 0x4001;
        local_68.pSrcList = pSVar2;
        local_68.pNext = pOuterNC;
        iVar12 = sqlite3ResolveExprListNames(&local_68,pSVar23->pEList);
        if (iVar12 != 0) goto LAB_0019c87d;
        pEVar5 = pSVar23->pGroupBy;
        if (pEVar5 == (ExprList *)0x0 && (local_68.ncFlags & 0x10U) == 0) {
          uVar13 = local_68.ncFlags & 0xffffbfee;
        }
        else {
          uVar13 = local_68.ncFlags & 0xffffbfff;
          pSVar23->selFlags = local_68.ncFlags & 0x8001000U | pSVar23->selFlags | 8;
        }
        local_68.uNC = (anon_union_8_4_82a96254_for_uNC)pSVar23->pEList;
        local_68._40_8_ = CONCAT44(local_68._44_4_,uVar13) | 0x80;
        if (pSVar23->pHaving != (Expr *)0x0) {
          if ((pSVar23->selFlags & 8) == 0) {
            pcVar21 = "HAVING clause on a non-aggregate query";
            goto LAB_0019c873;
          }
          iVar12 = sqlite3ResolveExprNames(&local_68,pSVar23->pHaving);
          if (iVar12 != 0) goto LAB_0019c87d;
        }
        iVar12 = sqlite3ResolveExprNames(&local_68,pSVar23->pWhere);
        if (iVar12 != 0) goto LAB_0019c87d;
        lVar22 = 0x60;
        for (lVar20 = 0; pSVar2 = pSVar23->pSrc, lVar20 < pSVar2->nSrc; lVar20 = lVar20 + 1) {
          if (((*(byte *)((long)pSVar2->a + lVar22 + -0x23) & 4) != 0) &&
             (iVar12 = sqlite3ResolveExprListNames
                                 (&local_68,*(ExprList **)((long)pSVar2->a + lVar22 + -8)),
             iVar12 != 0)) goto LAB_0019c87d;
          lVar22 = lVar22 + 0x68;
        }
        if (1 < pParse->eParseMode) {
          ppWVar24 = &pSVar23->pWinDefn;
          while (pWVar6 = *ppWVar24, pWVar6 != (Window *)0x0) {
            iVar12 = sqlite3ResolveExprListNames(&local_68,pWVar6->pOrderBy);
            if (iVar12 != 0) goto LAB_0019c87d;
            iVar12 = sqlite3ResolveExprListNames(&local_68,pWVar6->pPartition);
            ppWVar24 = &pWVar6->pNextWin;
            if (iVar12 != 0) goto LAB_0019c87d;
          }
        }
        psVar7 = local_70;
        local_68.pNext = (NameContext *)0x0;
        local_68._40_8_ = local_68._40_8_ | 0x4001;
        if ((pSVar23->selFlags & 0x10000) != 0) {
          pSVar3 = pSVar23->pSrc->a[0].pSelect;
          pSVar23->pOrderBy = pSVar3->pOrderBy;
          pSVar3->pOrderBy = (ExprList *)0x0;
        }
        iVar12 = (int)local_78;
        if ((((pSVar23->pOrderBy != (ExprList *)0x0) &&
             (pSVar26 == (Select *)0x0 || (int)local_78 != 0)) &&
            (iVar11 = resolveOrderGroupBy(&local_68,pSVar23,pSVar23->pOrderBy,"ORDER"), iVar11 != 0)
            ) || (psVar7->mallocFailed != '\0')) goto LAB_0019c87d;
        local_68._40_8_ = local_68._40_8_ & 0xffffffffffffbfff;
        if (pEVar5 != (ExprList *)0x0) {
          iVar11 = resolveOrderGroupBy(&local_68,pSVar23,pEVar5,"GROUP");
          if ((iVar11 != 0) || (psVar7->mallocFailed != '\0')) goto LAB_0019c87d;
          iVar11 = pEVar5->nExpr;
          pEVar15 = pEVar5->a;
          if (iVar11 < 1) {
            iVar11 = 0;
          }
          while (bVar27 = iVar11 != 0, iVar11 = iVar11 + -1, bVar27) {
            if ((pEVar15->pExpr->flags & 0x10) != 0) {
              pcVar21 = "aggregate functions are not allowed in the GROUP BY clause";
              goto LAB_0019c873;
            }
            pEVar15 = pEVar15 + 1;
          }
        }
        pSVar3 = pSVar23->pNext;
        if ((pSVar3 != (Select *)0x0) && (pSVar23->pEList->nExpr != pSVar3->pEList->nExpr)) {
          if ((pSVar3->selFlags & 0x200) != 0) {
            pcVar21 = "all VALUES must have the same number of terms";
            goto LAB_0019c873;
          }
          bVar10 = pSVar3->op + 0x79;
          if (bVar10 < 3) {
            pcVar21 = (&PTR_anon_var_dwarf_12097_0021c3b0)[bVar10];
          }
          else {
            pcVar21 = "UNION";
          }
          sqlite3ErrorMsg(pParse,
                          "SELECTs to the left and right of %s do not have the same number of result columns"
                          ,pcVar21);
          goto LAB_0019c87d;
        }
        pSVar23 = pSVar23->pPrior;
        iVar12 = iVar12 + 1;
      }
      iVar12 = 1;
      if ((pSVar26 != (Select *)0x0) &&
         (pEVar5 = p->pOrderBy, iVar12 = 1, pEVar5 != (ExprList *)0x0)) {
        psVar7 = pParse->db;
        uVar13 = pEVar5->nExpr;
        if (psVar7->aLimit[2] < (int)uVar13) {
          pcVar21 = "too many terms in ORDER BY clause";
LAB_0019c873:
          sqlite3ErrorMsg(pParse,pcVar21);
LAB_0019c87d:
          iVar12 = 2;
        }
        else {
          local_70 = (sqlite3 *)pEVar5->a;
          lVar22 = 0;
          uVar17 = 0;
          if (0 < (int)uVar13) {
            uVar17 = (ulong)uVar13;
          }
          for (; uVar17 * 0x18 - lVar22 != 0; lVar22 = lVar22 + 0x18) {
            pbVar1 = &pEVar5->a[0].fg.field_0x1 + lVar22;
            *pbVar1 = *pbVar1 & 0xfb;
          }
          pSVar26 = (Select *)0x0;
          do {
            pSVar23 = p;
            pSVar23->pNext = pSVar26;
            p = pSVar23->pPrior;
            pSVar26 = pSVar23;
          } while (pSVar23->pPrior != (Select *)0x0);
          bVar27 = true;
          while ((pSVar23 != (Select *)0x0 && (bVar27))) {
            local_78 = (Parse *)pSVar23->pEList;
            bVar27 = false;
            psVar25 = local_70;
            for (iVar12 = 0; iVar12 < (int)uVar13; iVar12 = iVar12 + 1) {
              local_7c = -1;
              bVar9 = bVar27;
              if ((((ulong)((anon_union_8_2_a01b6dbf_for_x *)&((ExprList_item *)psVar25)->fg)->pList
                   & 0x400) == 0) &&
                 (p_00 = sqlite3ExprSkipCollateAndLikely(((ExprList_item *)psVar25)->pExpr),
                 p_00 != (Expr *)0x0)) {
                iVar11 = sqlite3ExprIsInteger(p_00,&local_7c);
                if (iVar11 == 0) {
                  iVar11 = resolveAsName(local_78,(ExprList *)p_00,pE);
                  if (iVar11 == 0) {
                    iVar11 = 0;
                    pEVar14 = sqlite3ExprDup(psVar7,p_00,0);
                    if (((psVar7->mallocFailed == '\0') &&
                        (iVar11 = resolveOrderByTermToExprList(pParse,pSVar23,pEVar14),
                        1 < pParse->eParseMode)) && (0 < iVar11)) {
                      resolveOrderByTermToExprList(pParse,pSVar23,p_00);
                    }
                    sqlite3ExprDelete(psVar7,pEVar14);
                  }
                  bVar9 = true;
                  if (iVar11 < 1) goto LAB_0019ca95;
                }
                else if ((local_7c < 1) || (iVar11 = local_7c, *(int *)&local_78->db < local_7c)) {
                  resolveOutOfRangeError(pParse,"ORDER",iVar12 + 1,*(int *)&local_78->db,p_00);
                  goto LAB_0019c87d;
                }
                if (pParse->eParseMode < 2) {
                  pEVar14 = sqlite3Expr(psVar7,0x9b,(char *)0x0);
                  if (pEVar14 == (Expr *)0x0) goto LAB_0019c87d;
                  pbVar1 = (byte *)((long)&pEVar14->flags + 1);
                  *pbVar1 = *pbVar1 | 8;
                  (pEVar14->u).iValue = iVar11;
                  pEVar15 = (ExprList_item *)psVar25;
                  pEVar8 = ((ExprList_item *)psVar25)->pExpr;
                  if (((ExprList_item *)psVar25)->pExpr != p_00) {
                    do {
                      pEVar18 = pEVar8;
                      pEVar8 = pEVar18->pLeft;
                    } while (pEVar8->op == 'q');
                    pEVar15 = (ExprList_item *)&pEVar18->pLeft;
                  }
                  pEVar15->pExpr = pEVar14;
                  sqlite3ExprDeleteNN(psVar7,p_00);
                  (((ExprList_item *)psVar25)->u).x.iOrderByCol = (u16)iVar11;
                }
                pbVar1 = (byte *)((long)&((ExprList_item *)psVar25)->fg + 1);
                *pbVar1 = *pbVar1 | 4;
                bVar9 = bVar27;
              }
LAB_0019ca95:
              bVar27 = bVar9;
              psVar25 = (sqlite3 *)((long)psVar25 + 0x18);
              uVar13 = pEVar5->nExpr;
            }
            pSVar23 = pSVar23->pNext;
          }
          uVar16 = 0;
          uVar17 = (ulong)uVar13;
          if ((int)uVar13 < 1) {
            uVar17 = uVar16;
          }
          iVar12 = 1;
          uVar19 = 1;
          for (; uVar17 * 0x18 - uVar16 != 0; uVar16 = uVar16 + 0x18) {
            if (((&pEVar5->a[0].fg.field_0x1)[uVar16] & 4) == 0) {
              sqlite3ErrorMsg(pParse,"%r ORDER BY term does not match any column in the result set",
                              uVar19);
              goto LAB_0019c87d;
            }
            uVar19 = (ulong)((int)uVar19 + 1);
          }
        }
      }
    }
  }
  return iVar12;
}

Assistant:

static int resolveSelectStep(Walker *pWalker, Select *p){
  NameContext *pOuterNC;  /* Context that contains this SELECT */
  NameContext sNC;        /* Name context of this SELECT */
  int isCompound;         /* True if p is a compound select */
  int nCompound;          /* Number of compound terms processed so far */
  Parse *pParse;          /* Parsing context */
  int i;                  /* Loop counter */
  ExprList *pGroupBy;     /* The GROUP BY clause */
  Select *pLeftmost;      /* Left-most of SELECT of a compound */
  sqlite3 *db;            /* Database connection */


  assert( p!=0 );
  if( p->selFlags & SF_Resolved ){
    return WRC_Prune;
  }
  pOuterNC = pWalker->u.pNC;
  pParse = pWalker->pParse;
  db = pParse->db;

  /* Normally sqlite3SelectExpand() will be called first and will have
  ** already expanded this SELECT.  However, if this is a subquery within
  ** an expression, sqlite3ResolveExprNames() will be called without a
  ** prior call to sqlite3SelectExpand().  When that happens, let
  ** sqlite3SelectPrep() do all of the processing for this SELECT.
  ** sqlite3SelectPrep() will invoke both sqlite3SelectExpand() and
  ** this routine in the correct order.
  */
  if( (p->selFlags & SF_Expanded)==0 ){
    sqlite3SelectPrep(pParse, p, pOuterNC);
    return pParse->nErr ? WRC_Abort : WRC_Prune;
  }

  isCompound = p->pPrior!=0;
  nCompound = 0;
  pLeftmost = p;
  while( p ){
    assert( (p->selFlags & SF_Expanded)!=0 );
    assert( (p->selFlags & SF_Resolved)==0 );
    assert( db->suppressErr==0 ); /* SF_Resolved not set if errors suppressed */
    p->selFlags |= SF_Resolved;


    /* Resolve the expressions in the LIMIT and OFFSET clauses. These
    ** are not allowed to refer to any names, so pass an empty NameContext.
    */
    memset(&sNC, 0, sizeof(sNC));
    sNC.pParse = pParse;
    sNC.pWinSelect = p;
    if( sqlite3ResolveExprNames(&sNC, p->pLimit) ){
      return WRC_Abort;
    }

    /* If the SF_Converted flags is set, then this Select object was
    ** was created by the convertCompoundSelectToSubquery() function.
    ** In this case the ORDER BY clause (p->pOrderBy) should be resolved
    ** as if it were part of the sub-query, not the parent. This block
    ** moves the pOrderBy down to the sub-query. It will be moved back
    ** after the names have been resolved.  */
    if( p->selFlags & SF_Converted ){
      Select *pSub = p->pSrc->a[0].pSelect;
      assert( p->pSrc->nSrc==1 && p->pOrderBy );
      assert( pSub->pPrior && pSub->pOrderBy==0 );
      pSub->pOrderBy = p->pOrderBy;
      p->pOrderBy = 0;
    }

    /* Recursively resolve names in all subqueries in the FROM clause
    */
    for(i=0; i<p->pSrc->nSrc; i++){
      SrcItem *pItem = &p->pSrc->a[i];
      if( pItem->pSelect && (pItem->pSelect->selFlags & SF_Resolved)==0 ){
        int nRef = pOuterNC ? pOuterNC->nRef : 0;
        const char *zSavedContext = pParse->zAuthContext;

        if( pItem->zName ) pParse->zAuthContext = pItem->zName;
        sqlite3ResolveSelectNames(pParse, pItem->pSelect, pOuterNC);
        pParse->zAuthContext = zSavedContext;
        if( pParse->nErr ) return WRC_Abort;
        assert( db->mallocFailed==0 );

        /* If the number of references to the outer context changed when
        ** expressions in the sub-select were resolved, the sub-select
        ** is correlated. It is not required to check the refcount on any
        ** but the innermost outer context object, as lookupName() increments
        ** the refcount on all contexts between the current one and the
        ** context containing the column when it resolves a name. */
        if( pOuterNC ){
          assert( pItem->fg.isCorrelated==0 && pOuterNC->nRef>=nRef );
          pItem->fg.isCorrelated = (pOuterNC->nRef>nRef);
        }
      }
    }

    /* Set up the local name-context to pass to sqlite3ResolveExprNames() to
    ** resolve the result-set expression list.
    */
    sNC.ncFlags = NC_AllowAgg|NC_AllowWin;
    sNC.pSrcList = p->pSrc;
    sNC.pNext = pOuterNC;

    /* Resolve names in the result set. */
    if( sqlite3ResolveExprListNames(&sNC, p->pEList) ) return WRC_Abort;
    sNC.ncFlags &= ~NC_AllowWin;

    /* If there are no aggregate functions in the result-set, and no GROUP BY
    ** expression, do not allow aggregates in any of the other expressions.
    */
    assert( (p->selFlags & SF_Aggregate)==0 );
    pGroupBy = p->pGroupBy;
    if( pGroupBy || (sNC.ncFlags & NC_HasAgg)!=0 ){
      assert( NC_MinMaxAgg==SF_MinMaxAgg );
      assert( NC_OrderAgg==SF_OrderByReqd );
      p->selFlags |= SF_Aggregate | (sNC.ncFlags&(NC_MinMaxAgg|NC_OrderAgg));
    }else{
      sNC.ncFlags &= ~NC_AllowAgg;
    }

    /* Add the output column list to the name-context before parsing the
    ** other expressions in the SELECT statement. This is so that
    ** expressions in the WHERE clause (etc.) can refer to expressions by
    ** aliases in the result set.
    **
    ** Minor point: If this is the case, then the expression will be
    ** re-evaluated for each reference to it.
    */
    assert( (sNC.ncFlags & (NC_UAggInfo|NC_UUpsert|NC_UBaseReg))==0 );
    sNC.uNC.pEList = p->pEList;
    sNC.ncFlags |= NC_UEList;
    if( p->pHaving ){
      if( (p->selFlags & SF_Aggregate)==0 ){
        sqlite3ErrorMsg(pParse, "HAVING clause on a non-aggregate query");
        return WRC_Abort;
      }
      if( sqlite3ResolveExprNames(&sNC, p->pHaving) ) return WRC_Abort;
    }
    if( sqlite3ResolveExprNames(&sNC, p->pWhere) ) return WRC_Abort;

    /* Resolve names in table-valued-function arguments */
    for(i=0; i<p->pSrc->nSrc; i++){
      SrcItem *pItem = &p->pSrc->a[i];
      if( pItem->fg.isTabFunc
       && sqlite3ResolveExprListNames(&sNC, pItem->u1.pFuncArg)
      ){
        return WRC_Abort;
      }
    }

#ifndef SQLITE_OMIT_WINDOWFUNC
    if( IN_RENAME_OBJECT ){
      Window *pWin;
      for(pWin=p->pWinDefn; pWin; pWin=pWin->pNextWin){
        if( sqlite3ResolveExprListNames(&sNC, pWin->pOrderBy)
         || sqlite3ResolveExprListNames(&sNC, pWin->pPartition)
        ){
          return WRC_Abort;
        }
      }
    }
#endif

    /* The ORDER BY and GROUP BY clauses may not refer to terms in
    ** outer queries
    */
    sNC.pNext = 0;
    sNC.ncFlags |= NC_AllowAgg|NC_AllowWin;

    /* If this is a converted compound query, move the ORDER BY clause from
    ** the sub-query back to the parent query. At this point each term
    ** within the ORDER BY clause has been transformed to an integer value.
    ** These integers will be replaced by copies of the corresponding result
    ** set expressions by the call to resolveOrderGroupBy() below.  */
    if( p->selFlags & SF_Converted ){
      Select *pSub = p->pSrc->a[0].pSelect;
      p->pOrderBy = pSub->pOrderBy;
      pSub->pOrderBy = 0;
    }

    /* Process the ORDER BY clause for singleton SELECT statements.
    ** The ORDER BY clause for compounds SELECT statements is handled
    ** below, after all of the result-sets for all of the elements of
    ** the compound have been resolved.
    **
    ** If there is an ORDER BY clause on a term of a compound-select other
    ** than the right-most term, then that is a syntax error.  But the error
    ** is not detected until much later, and so we need to go ahead and
    ** resolve those symbols on the incorrect ORDER BY for consistency.
    */
    if( p->pOrderBy!=0
     && isCompound<=nCompound  /* Defer right-most ORDER BY of a compound */
     && resolveOrderGroupBy(&sNC, p, p->pOrderBy, "ORDER")
    ){
      return WRC_Abort;
    }
    if( db->mallocFailed ){
      return WRC_Abort;
    }
    sNC.ncFlags &= ~NC_AllowWin;

    /* Resolve the GROUP BY clause.  At the same time, make sure
    ** the GROUP BY clause does not contain aggregate functions.
    */
    if( pGroupBy ){
      struct ExprList_item *pItem;

      if( resolveOrderGroupBy(&sNC, p, pGroupBy, "GROUP") || db->mallocFailed ){
        return WRC_Abort;
      }
      for(i=0, pItem=pGroupBy->a; i<pGroupBy->nExpr; i++, pItem++){
        if( ExprHasProperty(pItem->pExpr, EP_Agg) ){
          sqlite3ErrorMsg(pParse, "aggregate functions are not allowed in "
              "the GROUP BY clause");
          return WRC_Abort;
        }
      }
    }

    /* If this is part of a compound SELECT, check that it has the right
    ** number of expressions in the select list. */
    if( p->pNext && p->pEList->nExpr!=p->pNext->pEList->nExpr ){
      sqlite3SelectWrongNumTermsError(pParse, p->pNext);
      return WRC_Abort;
    }

    /* Advance to the next term of the compound
    */
    p = p->pPrior;
    nCompound++;
  }

  /* Resolve the ORDER BY on a compound SELECT after all terms of
  ** the compound have been resolved.
  */
  if( isCompound && resolveCompoundOrderBy(pParse, pLeftmost) ){
    return WRC_Abort;
  }

  return WRC_Prune;
}